

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

void cf_he_ctx_clear(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  void *pvVar2;
  long lVar3;
  
  pvVar1 = cf->ctx;
  lVar3 = 0;
  do {
    pvVar2 = *(void **)((long)pvVar1 + lVar3 * 8 + 0x20);
    if (pvVar2 != (void *)0x0) {
      if (*(long *)((long)pvVar2 + 0x28) != 0) {
        Curl_conn_cf_discard_chain((Curl_cfilter **)((long)pvVar2 + 0x28),data);
      }
      (*Curl_cfree)(pvVar2);
    }
    *(undefined8 *)((long)pvVar1 + lVar3 * 8 + 0x20) = 0;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  pvVar2 = *(void **)((long)pvVar1 + 0x30);
  if (pvVar2 != (void *)0x0) {
    if (*(long *)((long)pvVar2 + 0x28) != 0) {
      Curl_conn_cf_discard_chain((Curl_cfilter **)((long)pvVar2 + 0x28),data);
    }
    (*Curl_cfree)(pvVar2);
  }
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  return;
}

Assistant:

static void cf_he_ctx_clear(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_he_ctx *ctx = cf->ctx;
  size_t i;

  DEBUGASSERT(ctx);
  DEBUGASSERT(data);
  for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
    baller_free(ctx->baller[i], data);
    ctx->baller[i] = NULL;
  }
  baller_free(ctx->winner, data);
  ctx->winner = NULL;
}